

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_icc.c
# Opt level: O0

int jas_icctxtdesc_copy(jas_iccattrval_t *attrval,jas_iccattrval_t *othattrval)

{
  jas_icctxtdesc_t *txtdesc;
  jas_iccattrval_t *othattrval_local;
  jas_iccattrval_t *attrval_local;
  
  abort();
}

Assistant:

static int jas_icctxtdesc_copy(jas_iccattrval_t *attrval,
  jas_iccattrval_t *othattrval)
{
	jas_icctxtdesc_t *txtdesc = &attrval->data.txtdesc;

	/* Avoid compiler warnings about unused parameters. */
	(void)attrval;
	(void)othattrval;
	(void)txtdesc;

	/* Not yet implemented. */
	abort();
	return -1;
}